

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fiber.c
# Opt level: O1

void fiber1_fn(sx_fiber_transfer transfer)

{
  puts("Fiber1");
  sx_fiber_switch(transfer.from,transfer.user);
  puts("Fiber1 - End");
  sx_fiber_switch(transfer.from,transfer.user);
  return;
}

Assistant:

void fiber1_fn(sx_fiber_transfer transfer)
{
    puts("Fiber1");
    sx_fiber_switch(transfer.from, transfer.user);    // Get back to where fiber1 is switched
    puts("Fiber1 - End");
    sx_fiber_switch(
        transfer.from,
        transfer.user);    // Always put this to return to caller at the end of the callback
}